

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<Position,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Position>(EntityManager *this,Id id)

{
  ComponentHandle<Position,_entityx::EntityManager> CVar1;
  Pool<Position,_8192UL> *pPVar2;
  char *pcVar3;
  Position *this_00;
  EntityManager *this_01;
  int __c;
  int __c_00;
  Id in_RSI;
  EntityManager *in_RDI;
  EventManager *unaff_retaddr;
  Pool<Position,_8192UL> *pool;
  Family family;
  ComponentHandle<Position,_entityx::EntityManager> component;
  undefined1 __val;
  Id *this_02;
  BasePool *in_stack_ffffffffffffff80;
  Entity local_50;
  EntityManager *in_stack_ffffffffffffffc0;
  Id local_18;
  ComponentHandle<Position,_entityx::EntityManager> *in_stack_fffffffffffffff0;
  Id in_stack_fffffffffffffff8;
  
  local_18.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  component_family<Position>();
  pPVar2 = accomodate_component<Position>(in_stack_ffffffffffffffc0);
  __val = (undefined1)((ulong)pPVar2 >> 0x38);
  this_02 = &local_18;
  pcVar3 = Entity::Id::index(this_02,(char *)in_RSI.id_,__c);
  pcVar3 = (char *)((ulong)pcVar3 & 0xffffffff);
  this_00 = (Position *)BasePool::get(in_stack_ffffffffffffff80,(size_t)this_02);
  Position::Position(this_00,0.0,0.0);
  this_01 = in_RDI + 0x48;
  pcVar3 = Entity::Id::index(this_02,pcVar3,__c_00);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            ((vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)this_01,
             (ulong)pcVar3 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::set((bitset<64UL> *)this_01,(size_t)this_02,(bool)__val);
  ComponentHandle<Position,_entityx::EntityManager>::ComponentHandle
            ((ComponentHandle<Position,_entityx::EntityManager> *)&stack0xfffffffffffffff0,in_RDI,
             local_18);
  Entity::Entity(&local_50,in_RDI,local_18);
  EventManager::
  emit<entityx::ComponentAddedEvent<Position>,entityx::Entity,entityx::ComponentHandle<Position,entityx::EntityManager>&>
            (unaff_retaddr,(Entity *)in_stack_fffffffffffffff8.id_,in_stack_fffffffffffffff0);
  CVar1.id_.id_ = in_stack_fffffffffffffff8.id_;
  CVar1.manager_ = (EntityManager *)in_stack_fffffffffffffff0;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }